

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  long lVar2;
  char *__s;
  double *pdVar3;
  ostream *poVar4;
  long lVar5;
  long *plVar6;
  size_t sVar7;
  char **ppcVar8;
  pointer piVar9;
  double *time;
  double *pdVar10;
  size_t size;
  ulong uVar11;
  initializer_list<int> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<const_char_*> __l_01;
  vector<const_char_*,_std::allocator<const_char_*>_> structure;
  Treap<unsigned_long> tp;
  SplayTree<unsigned_long> st;
  vector<unsigned_long,_std::allocator<unsigned_long>_> insertable;
  vector<unsigned_long,_std::allocator<unsigned_long>_> whole;
  vector<unsigned_long,_std::allocator<unsigned_long>_> init;
  vector<const_char_*,_std::allocator<const_char_*>_> ops;
  vector<unsigned_long,_std::allocator<unsigned_long>_> eraseable;
  vector<unsigned_long,_std::allocator<unsigned_long>_> findable;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> set;
  vector<int,_std::allocator<int>_> n;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  res;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1d0;
  char **local_1b8;
  char *pcStack_1b0;
  char *local_1a8;
  long lStack_1a0;
  Treap<unsigned_long> local_198;
  SplayTree<unsigned_long> local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_188;
  long *local_170 [2];
  long local_160 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  int *local_120;
  int *local_118;
  vector<const_char_*,_std::allocator<const_char_*>_> local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_c8._M_impl._0_8_ = 0x186a000004e20;
  local_c8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0x2625a00007a120;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_1b8);
  local_120 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar9 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      iVar1 = *piVar9;
      local_118 = piVar9;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," elements",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      local_190.root = (Node *)0x0;
      local_198.root = (Node *)0x0;
      local_c8._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_c8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_c8._M_impl.super__Rb_tree_header._M_header;
      local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
      randVec(&local_138,(long)iVar1);
      size = (size_t)(iVar1 / 10);
      randVec(&local_188,size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_150,&local_138);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_150,
                 local_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_188.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_188.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,&local_150);
      getRandomPart(&local_e0,&local_78,size);
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_90,&local_150);
      getRandomPart(&local_f8,&local_90,size);
      if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      initialize<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                (&local_138,&local_190,&local_198,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_c8);
      run<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                (&local_48,&local_188,&local_e0,&local_f8,&local_190,&local_198,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_c8);
      local_1a8 = "erase";
      local_1b8 = (char **)0x105116;
      pcStack_1b0 = "find ";
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&local_1b8;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_110,__l_00,(allocator_type *)local_170);
      local_1a8 = "std::set";
      local_1b8 = (char **)0x10506e;
      pcStack_1b0 = "Treap ";
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)&local_1b8;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_1d0,__l_01,(allocator_type *)local_170);
      lVar5 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
      lVar2 = *(long *)(lVar5 + -0x18);
      if (*(char *)(lVar2 + 0x10a1b1) == '\0') {
        std::ios::widen((char)lVar2 + -0x30);
        *(undefined1 *)(lVar2 + 0x10a1b1) = 1;
        lVar5 = std::cout;
      }
      *(undefined1 *)(lVar2 + 0x10a1b0) = 0x20;
      *(undefined8 *)(__cxa_rethrow + *(long *)(lVar5 + -0x18)) = 0xd;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
      if (local_1d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xd;
          local_170[0] = local_160;
          std::__cxx11::string::_M_construct((ulong)local_170,(char)uVar11);
          plVar6 = (long *)std::__cxx11::string::append((char *)local_170);
          ppcVar8 = (char **)(plVar6 + 2);
          if ((char **)*plVar6 == ppcVar8) {
            local_1a8 = *ppcVar8;
            lStack_1a0 = plVar6[3];
            local_1b8 = &local_1a8;
          }
          else {
            local_1a8 = *ppcVar8;
            local_1b8 = (char **)*plVar6;
          }
          pcStack_1b0 = (char *)plVar6[1];
          *plVar6 = (long)ppcVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1b8,(long)pcStack_1b0);
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,(ulong)(local_1a8 + 1));
          }
          if (local_170[0] != local_160) {
            operator_delete(local_170[0],local_160[0] + 1);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)local_1d0.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1d0.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      if (local_1d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          lVar2 = std::cout;
          *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xd;
          __s = local_110.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(lVar2 + -0x18) + 0x10a0d0);
          }
          else {
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar7);
          }
          pdVar3 = local_48.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar10 = local_48.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start; pdVar10 != pdVar3; pdVar10 = pdVar10 + 1)
          {
            *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xd;
            poVar4 = std::ostream::_M_insert<double>(*pdVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
          std::ostream::put(-0x30);
          std::ostream::flush();
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)local_1d0.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1d0.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_1d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d0.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_110.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_110.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_48);
      if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_188.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_c8);
      Treap<unsigned_long>::~Treap(&local_198);
      SplayTree<unsigned_long>::~SplayTree(&local_190);
      piVar9 = local_118 + 1;
    } while (piVar9 != local_120);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
  std::vector n{20'000, 100'000, 500'000, 2'500'000};

  for (auto n : n) {
    std::cout << n << " elements" << std::endl;

    SplayTree<std::uint64_t> st;
    Treap<std::uint64_t> tp;
    std::set<std::uint64_t> set;

    auto init = randVec(n);
    auto insertable = randVec(n / 10);

    auto whole = init;
    whole.insert(whole.end(), insertable.begin(), insertable.end());

    auto findable = getRandomPart(whole, n / 10);
    auto eraseable = getRandomPart(whole, n / 10);

    initialize(init, st, tp, set);
    auto res = run(insertable, findable, eraseable, st, tp, set);

    std::vector ops{"insert", "find ", "erase"};
    std::vector structure{"SplayTree", "Treap ", "std::set"};

    std::cout << std::left << std::setfill(' ') << std::setw(13) << "";
    for (std::size_t i = 0; i < structure.size(); ++i)
      std::cout << std::setw(13) << std::string(i, ' ') + structure[i];
    std::cout << std::endl;

    for (std::size_t i = 0; i < structure.size(); ++i) {
      std::cout << std::setw(13) << ops[i];
      for (auto &time : res[i])
        std::cout << std::setw(13) << time << " ";
      std::cout << std::endl;
    }
  }
}